

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int cmf4kf_(int *lot,int *ido,int *l1,int *na,double *cc,int *im1,int *in1,double *ch,int *im2,
           int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  uint uVar41;
  long lVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  int local_144;
  int local_d0;
  int local_cc;
  
  uVar4 = *ido;
  uVar30 = (ulong)uVar4;
  iVar32 = uVar4 * 4;
  iVar5 = *in1;
  uVar6 = *l1;
  uVar26 = (ulong)uVar6;
  uVar41 = (uVar4 + 1) * uVar6;
  iVar1 = ~uVar41 * iVar5 * 2 + -3;
  iVar7 = *in2;
  uVar23 = uVar6 * 5;
  iVar2 = ~uVar23 * iVar7 * 2 + -3;
  iVar8 = *im1;
  lVar28 = (long)iVar8;
  lVar35 = ((long)*lot + -1) * lVar28;
  iVar10 = (int)lVar35;
  iVar37 = iVar10 + 1;
  iVar9 = *im2;
  if ((int)uVar4 < 2) {
    dVar43 = 1.0 / (double)(int)(uVar6 * 4);
    if (*na == 1) {
      if (0 < (int)uVar6) {
        bVar16 = -1 < iVar10;
        if (iVar8 < 0) {
          bVar16 = iVar10 < 1;
        }
        iVar17 = (uVar41 + 1) * iVar5 * 2;
        iVar39 = ((uVar4 * 3 + 1) * uVar6 + 1) * iVar5 * 2;
        iVar3 = ((uVar4 * 2 + 1) * uVar6 + 1) * iVar5 * 2;
        iVar32 = ((iVar32 + 1) * uVar6 + 1) * iVar5 * 2;
        iVar11 = (uVar6 * 8 + 1) * iVar7 * 2;
        iVar12 = (uVar6 * 6 + 1) * iVar7 * 2;
        iVar13 = (uVar6 * 7 + 1) * iVar7 * 2;
        iVar14 = (uVar23 + 1) * iVar7 * 2;
        lVar35 = 1;
        iVar25 = 0;
        iVar24 = 0;
        do {
          lVar19 = lVar28 + 1;
          iVar22 = iVar24;
          iVar27 = iVar25;
          if (bVar16) {
            do {
              dVar44 = cc[(long)iVar1 + (long)(iVar17 + 2 + iVar22) + 2] -
                       cc[(long)iVar1 + (long)(iVar39 + 2 + iVar22) + 2];
              dVar45 = cc[(long)iVar1 + (long)(iVar17 + 2 + iVar22) + 2] +
                       cc[(long)iVar1 + (long)(iVar39 + 2 + iVar22) + 2];
              dVar46 = cc[(long)iVar1 + (long)(iVar3 + 2 + iVar22) + 2] -
                       cc[(long)iVar1 + (long)(iVar32 + 2 + iVar22) + 2];
              dVar49 = cc[(long)iVar1 + (long)(iVar3 + 2 + iVar22) + 2] +
                       cc[(long)iVar1 + (long)(iVar32 + 2 + iVar22) + 2];
              dVar48 = cc[(long)iVar1 + (long)(iVar17 + 3 + iVar22)] -
                       cc[(long)iVar1 + (long)(iVar39 + 3 + iVar22)];
              dVar50 = cc[(long)iVar1 + (long)(iVar17 + 3 + iVar22)] +
                       cc[(long)iVar1 + (long)(iVar39 + 3 + iVar22)];
              dVar47 = cc[(long)iVar1 + (long)(iVar32 + 3 + iVar22)] -
                       cc[(long)iVar1 + (long)(iVar3 + 3 + iVar22)];
              dVar51 = cc[(long)iVar1 + (long)(iVar32 + 3 + iVar22)] +
                       cc[(long)iVar1 + (long)(iVar3 + 3 + iVar22)];
              ch[(long)iVar2 + (long)(iVar14 + 3 + iVar27)] = (dVar50 + dVar51) * dVar43;
              ch[(long)iVar2 + (long)(iVar13 + 3 + iVar27)] = (dVar50 - dVar51) * dVar43;
              ch[(long)iVar2 + (long)(iVar14 + 2 + iVar27) + 2] = (dVar45 + dVar49) * dVar43;
              ch[(long)iVar2 + (long)(iVar13 + 2 + iVar27) + 2] = (dVar45 - dVar49) * dVar43;
              ch[(long)iVar2 + (long)(iVar12 + 3 + iVar27)] = (dVar46 + dVar48) * dVar43;
              ch[(long)iVar2 + (long)(iVar11 + 3 + iVar27)] = (dVar48 - dVar46) * dVar43;
              ch[(long)iVar2 + (long)(iVar12 + 2 + iVar27) + 2] = (dVar44 + dVar47) * dVar43;
              ch[(long)iVar2 + (long)(iVar11 + 2 + iVar27) + 2] = (dVar44 - dVar47) * dVar43;
              bVar15 = lVar19 <= iVar37;
              if (iVar8 < 0) {
                bVar15 = iVar10 < lVar19;
              }
              lVar19 = lVar19 + lVar28;
              iVar22 = iVar22 + iVar8 * 2;
              iVar27 = iVar27 + iVar9 * 2;
            } while (bVar15);
          }
          lVar35 = lVar35 + 1;
          iVar24 = iVar24 + iVar5 * 2;
          iVar25 = iVar25 + iVar7 * 2;
        } while (lVar35 != uVar26 + 1);
      }
    }
    else if (0 < (int)uVar6) {
      bVar16 = -1 < iVar10;
      if (iVar8 < 0) {
        bVar16 = iVar10 < 1;
      }
      iVar2 = (uVar41 + 1) * iVar5 * 2;
      iVar7 = ((uVar4 * 3 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar9 = ((uVar4 * 2 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar32 = ((iVar32 + 1) * uVar6 + 1) * iVar5 * 2;
      lVar35 = 1;
      iVar17 = 0;
      do {
        lVar19 = lVar28 + 1;
        iVar39 = iVar17;
        if (bVar16) {
          do {
            lVar36 = (long)(iVar2 + iVar39 + 2);
            dVar44 = cc[(long)iVar1 + lVar36 + 2];
            lVar38 = (long)(iVar7 + 2 + iVar39);
            dVar45 = cc[(long)iVar1 + lVar38 + 2];
            lVar40 = (long)(iVar9 + 2 + iVar39);
            dVar46 = cc[(long)iVar1 + lVar40 + 2];
            lVar21 = (long)(iVar32 + 2 + iVar39);
            dVar47 = cc[(long)iVar1 + lVar21 + 2];
            lVar29 = (long)(iVar2 + 3 + iVar39);
            dVar48 = cc[iVar1 + lVar29];
            lVar34 = (long)(iVar7 + 3 + iVar39);
            dVar49 = cc[iVar1 + lVar34];
            dVar52 = dVar48 + dVar49;
            lVar31 = (long)(iVar32 + 3 + iVar39);
            dVar50 = cc[iVar1 + lVar31];
            lVar42 = (long)(iVar9 + 3 + iVar39);
            dVar51 = cc[iVar1 + lVar42];
            dVar53 = dVar50 + dVar51;
            cc[iVar1 + lVar29] = (dVar52 + dVar53) * dVar43;
            cc[iVar1 + lVar34] = (dVar52 - dVar53) * dVar43;
            dVar52 = dVar44 + dVar45;
            dVar53 = dVar46 + dVar47;
            cc[(long)iVar1 + lVar36 + 2] = (dVar52 + dVar53) * dVar43;
            cc[(long)iVar1 + lVar38 + 2] = (dVar52 - dVar53) * dVar43;
            dVar46 = dVar46 - dVar47;
            dVar48 = dVar48 - dVar49;
            cc[iVar1 + lVar42] = (dVar46 + dVar48) * dVar43;
            cc[iVar1 + lVar31] = (dVar48 - dVar46) * dVar43;
            dVar44 = dVar44 - dVar45;
            dVar50 = dVar50 - dVar51;
            cc[(long)iVar1 + lVar40 + 2] = (dVar44 + dVar50) * dVar43;
            bVar15 = lVar19 <= iVar37;
            if (iVar8 < 0) {
              bVar15 = iVar10 < lVar19;
            }
            cc[(long)iVar1 + lVar21 + 2] = (dVar44 - dVar50) * dVar43;
            lVar19 = lVar19 + lVar28;
            iVar39 = iVar39 + iVar8 * 2;
          } while (bVar15);
        }
        lVar35 = lVar35 + 1;
        iVar17 = iVar17 + iVar5 * 2;
      } while (lVar35 != uVar26 + 1);
    }
  }
  else {
    iVar17 = uVar4 * 4 + 1;
    if (0 < (int)uVar6) {
      bVar16 = -1 < iVar10;
      if (iVar8 < 0) {
        bVar16 = iVar10 < 1;
      }
      iVar39 = (uVar41 + 1) * iVar5 * 2;
      iVar3 = ((uVar4 * 3 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar11 = ((uVar4 * 2 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar12 = ((iVar32 + 1) * uVar6 + 1) * iVar5 * 2;
      iVar13 = (uVar6 * 8 + 1) * iVar7 * 2;
      iVar14 = (uVar6 * 6 + 1) * iVar7 * 2;
      iVar24 = (uVar6 * 7 + 1) * iVar7 * 2;
      iVar25 = (uVar23 + 1) * iVar7 * 2;
      lVar19 = 1;
      iVar22 = 0;
      iVar27 = 0;
      do {
        lVar40 = lVar28 + 1;
        iVar18 = iVar22;
        iVar33 = iVar27;
        if (bVar16) {
          do {
            dVar43 = cc[(long)iVar1 + (long)(iVar39 + 2 + iVar33) + 2] -
                     cc[(long)iVar1 + (long)(iVar3 + 2 + iVar33) + 2];
            dVar44 = cc[(long)iVar1 + (long)(iVar39 + 2 + iVar33) + 2] +
                     cc[(long)iVar1 + (long)(iVar3 + 2 + iVar33) + 2];
            dVar45 = cc[(long)iVar1 + (long)(iVar11 + 2 + iVar33) + 2] -
                     cc[(long)iVar1 + (long)(iVar12 + 2 + iVar33) + 2];
            dVar46 = cc[(long)iVar1 + (long)(iVar11 + 2 + iVar33) + 2] +
                     cc[(long)iVar1 + (long)(iVar12 + 2 + iVar33) + 2];
            dVar47 = cc[(long)iVar1 + (long)(iVar39 + 3 + iVar33)] -
                     cc[(long)iVar1 + (long)(iVar3 + 3 + iVar33)];
            dVar49 = cc[(long)iVar1 + (long)(iVar39 + 3 + iVar33)] +
                     cc[(long)iVar1 + (long)(iVar3 + 3 + iVar33)];
            dVar48 = cc[(long)iVar1 + (long)(iVar12 + 3 + iVar33)] -
                     cc[(long)iVar1 + (long)(iVar11 + 3 + iVar33)];
            dVar50 = cc[(long)iVar1 + (long)(iVar12 + 3 + iVar33)] +
                     cc[(long)iVar1 + (long)(iVar11 + 3 + iVar33)];
            ch[(long)iVar2 + (long)(iVar25 + 3 + iVar18)] = dVar49 + dVar50;
            ch[(long)iVar2 + (long)(iVar24 + 3 + iVar18)] = dVar49 - dVar50;
            ch[(long)iVar2 + (long)(iVar25 + 2 + iVar18) + 2] = dVar44 + dVar46;
            ch[(long)iVar2 + (long)(iVar24 + 2 + iVar18) + 2] = dVar44 - dVar46;
            ch[(long)iVar2 + (long)(iVar14 + 3 + iVar18)] = dVar45 + dVar47;
            ch[(long)iVar2 + (long)(iVar13 + 3 + iVar18)] = dVar47 - dVar45;
            ch[(long)iVar2 + (long)(iVar14 + 2 + iVar18) + 2] = dVar43 + dVar48;
            ch[(long)iVar2 + (long)(iVar13 + 2 + iVar18) + 2] = dVar43 - dVar48;
            bVar15 = lVar40 <= iVar37;
            if (iVar8 < 0) {
              bVar15 = lVar35 < lVar40;
            }
            iVar33 = iVar33 + iVar8 * 2;
            lVar40 = lVar40 + lVar28;
            iVar18 = iVar18 + iVar9 * 2;
          } while (bVar15);
        }
        lVar19 = lVar19 + 1;
        iVar27 = iVar27 + iVar5 * 2;
        iVar22 = iVar22 + iVar7 * 2;
      } while (lVar19 != uVar26 + 1);
    }
    bVar16 = -1 < iVar10;
    if (iVar8 < 0) {
      bVar16 = iVar10 < 1;
    }
    uVar23 = 2;
    if (2 < (int)uVar4) {
      uVar23 = uVar4;
    }
    iVar3 = ((uVar4 + 2) * uVar6 + 1) * iVar5 * 2 + 3;
    iVar11 = ((uVar4 * 3 + 2) * uVar6 + 1) * iVar5 * 2;
    iVar12 = ((uVar4 * 2 + 2) * uVar6 + 1) * iVar5 * 2;
    iVar13 = ((iVar32 + 2) * uVar6 + 1) * iVar5 * 2;
    iVar39 = (uVar6 * 0xc + 1) * iVar7 * 2;
    iVar14 = (uVar6 * 0xb + 1) * iVar7 * 2;
    iVar24 = (uVar6 * 10 + 1) * iVar7 * 2;
    iVar25 = (uVar6 * 9 + 1) * iVar7 * 2;
    uVar26 = 2;
    local_cc = 0;
    local_d0 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar20 = 1;
        local_144 = local_d0;
        iVar22 = local_cc;
        do {
          lVar35 = lVar28 + 1;
          iVar27 = local_144;
          iVar33 = iVar22;
          if (bVar16) {
            do {
              dVar45 = cc[(long)iVar1 + (long)(iVar3 + iVar27 + -1) + 2] +
                       cc[(long)iVar1 + (long)(iVar11 + 2 + iVar27) + 2];
              dVar46 = cc[(long)iVar1 + (long)(iVar12 + 2 + iVar27) + 2] -
                       cc[(long)iVar1 + (long)(iVar13 + 2 + iVar27) + 2];
              dVar43 = cc[(long)iVar1 + (long)(iVar3 + iVar27 + -1) + 2] -
                       cc[(long)iVar1 + (long)(iVar11 + 2 + iVar27) + 2];
              dVar47 = cc[(long)iVar1 + (long)(iVar27 + iVar3)] +
                       cc[(long)iVar1 + (long)(iVar11 + 3 + iVar27)];
              dVar49 = cc[(long)iVar1 + (long)(iVar12 + 2 + iVar27) + 2] +
                       cc[(long)iVar1 + (long)(iVar13 + 2 + iVar27) + 2];
              dVar44 = cc[(long)iVar1 + (long)(iVar27 + iVar3)] -
                       cc[(long)iVar1 + (long)(iVar11 + 3 + iVar27)];
              dVar50 = cc[(long)iVar1 + (long)(iVar13 + 3 + iVar27)] +
                       cc[(long)iVar1 + (long)(iVar12 + 3 + iVar27)];
              dVar48 = cc[(long)iVar1 + (long)(iVar13 + 3 + iVar27)] -
                       cc[(long)iVar1 + (long)(iVar12 + 3 + iVar27)];
              ch[(long)iVar2 + (long)(iVar25 + 3 + iVar33)] = dVar47 + dVar50;
              ch[(long)iVar2 + (long)(iVar25 + 2 + iVar33) + 2] = dVar45 + dVar49;
              dVar51 = dVar46 + dVar44;
              dVar52 = dVar43 + dVar48;
              ch[(long)iVar2 + (long)(iVar24 + 3 + iVar33)] =
                   wa[(long)-iVar17 + (long)iVar32 + uVar26] * dVar51 +
                   wa[(long)-iVar17 + uVar30 * 7 + uVar26] * dVar52;
              dVar47 = dVar47 - dVar50;
              dVar45 = dVar45 - dVar49;
              ch[(long)iVar2 + (long)(iVar24 + 2 + iVar33) + 2] =
                   dVar52 * wa[(long)-iVar17 + (long)iVar32 + uVar26] -
                   dVar51 * wa[(long)-iVar17 + uVar30 * 7 + uVar26];
              ch[(long)iVar2 + (long)(iVar14 + iVar33 + 3)] =
                   wa[(long)-iVar17 + uVar30 * 5 + uVar26] * dVar47 +
                   wa[(long)-iVar17 + (long)(int)(uVar4 * 8) + uVar26] * dVar45;
              dVar44 = dVar44 - dVar46;
              dVar43 = dVar43 - dVar48;
              ch[(long)iVar2 + (long)(iVar14 + 2 + iVar33) + 2] =
                   dVar45 * wa[(long)-iVar17 + uVar30 * 5 + uVar26] -
                   dVar47 * wa[(long)-iVar17 + (long)(int)(uVar4 * 8) + uVar26];
              ch[(long)iVar2 + (long)(iVar39 + 3 + iVar33)] =
                   wa[(long)-iVar17 + uVar30 * 6 + uVar26] * dVar44 +
                   wa[(long)-iVar17 + uVar30 * 9 + uVar26] * dVar43;
              bVar15 = lVar35 <= iVar37;
              if (iVar8 < 0) {
                bVar15 = iVar10 < lVar35;
              }
              ch[(long)iVar2 + (long)(iVar39 + 2 + iVar33) + 2] =
                   dVar43 * wa[(long)-iVar17 + uVar30 * 6 + uVar26] -
                   dVar44 * wa[(long)-iVar17 + uVar30 * 9 + uVar26];
              lVar35 = lVar35 + lVar28;
              iVar27 = iVar27 + iVar8 * 2;
              iVar33 = iVar33 + iVar9 * 2;
            } while (bVar15);
          }
          uVar20 = uVar20 + 1;
          local_144 = local_144 + iVar5 * 2;
          iVar22 = iVar22 + iVar7 * 2;
        } while (uVar20 != uVar6 + 1);
      }
      uVar26 = uVar26 + 1;
      local_d0 = local_d0 + iVar5 * uVar6 * 2;
      local_cc = local_cc + iVar7 * uVar6 * 8;
    } while (uVar26 != uVar23 + 1);
  }
  return 0;
}

Assistant:

int cmf4kf_(int *lot, int *ido, int *l1, int
	*na, fft_real_t *cc, int *im1, int *in1, fft_real_t *ch, int *im2,
	int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int cc_dim2, cc_dim3, cc_dim4, cc_offset, ch_dim2, ch_dim3, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
     int i__, k, m1, m2;
     fft_real_t sn, ci2, ci3, ci4;
     int m1d;
     fft_real_t cr3, cr2, cr4, ti1, ti2, ti3, ti4;
     int m2s;
     fft_real_t tr1, tr2, tr3, tr4;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + (wa_dim1 << 2);
    wa -= wa_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ido;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * 5));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    if (*ido > 1) {
	goto L102;
    }
    sn = 1.0 / (fft_real_t) (*l1 << 2);
    if (*na == 1) {
	goto L106;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] = sn *
		     (tr2 + tr3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    sn * (tr2 - tr3);
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] = sn *
		     (ti2 + ti3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    sn * (ti2 - ti3);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 + tr4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 - tr4);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 + ti4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 - ti4);
/* L101: */
	}
    }
    return 0;
L106:
    i__3 = *l1;
    for (k = 1; k <= i__3; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__1 = *im1;
	for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = sn * (tr2 + tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = sn * (tr2 - tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = sn * (ti2 + ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = sn * (ti2 - ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = sn * (tr1 + tr4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = sn * (tr1 -
		    tr4);
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = sn * (ti1 + ti4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = sn * (ti1 -
		    ti4);
/* L107: */
	}
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = tr2 + tr3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = tr2 - tr3;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = ti2 + ti3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = ti2 - ti3;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = tr1 + tr4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = tr1 - tr4;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = ti1 + ti4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = ti1 - ti4;
/* L103: */
	}
    }
    i__3 = *ido;
    for (i__ = 2; i__ <= i__3; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ti1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr4 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		tr2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		ti4 = cc[(m1 + (k + (i__ + (cc_dim4 << 2)) * cc_dim3) *
			cc_dim2 << 1) + 1] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			1)) * cc_dim3) * cc_dim2 << 1) + 1];
		tr3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 1];
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 1]
			 = tr2 + tr3;
		cr3 = tr2 - tr3;
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 2]
			 = ti2 + ti3;
		ci3 = ti2 - ti3;
		cr2 = tr1 + tr4;
		cr4 = tr1 - tr4;
		ci2 = ti1 + ti4;
		ci4 = ti1 - ti4;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + (wa_dim1 << 2)] * cr2 + wa[i__ + wa_dim1 *
			 7] * ci2;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + (wa_dim1 << 2)] * ci2 - wa[i__ + wa_dim1 *
			 7] * cr2;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 5] * cr3 + wa[i__ + (wa_dim1 <<
			3)] * ci3;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 5] * ci3 - wa[i__ + (wa_dim1 <<
			3)] * cr3;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 6] * cr4 + wa[i__ + wa_dim1 * 9]
			 * ci4;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 6] * ci4 - wa[i__ + wa_dim1 * 9]
			 * cr4;
/* L104: */
	    }
	}
/* L105: */
    }
    return 0;
}